

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPDefaultmapClause::generateDOT
          (OpenMPDefaultmapClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  OpenMPDefaultmapClauseCategory OVar1;
  pointer ppcVar2;
  allocator<char> local_1e1;
  string local_1e0;
  string node_id;
  int local_19c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string parameter_string;
  string indent;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string clause_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  std::__cxx11::to_string(&local_158,depth);
  std::operator+(&node_id,"defaultmap_",&local_158);
  std::operator+(&parameter_string,&node_id,"_");
  std::__cxx11::to_string(&local_1e0,index);
  std::operator+(&clause_kind,&parameter_string,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_158);
  std::operator+(&local_1e0,&indent,parent_node);
  std::operator+(&local_158,&local_1e0,"-- ");
  std::operator+(&node_id,&local_158,&clause_kind);
  std::operator+(&parameter_string,&node_id,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&parameter_string);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  OVar1 = this->category;
  parameter_string._M_dataplus._M_p = (pointer)&parameter_string.field_2;
  parameter_string._M_string_length = 0;
  parameter_string.field_2._M_local_buf[0] = '\0';
  if (this->behavior - OMPC_DEFAULTMAP_BEHAVIOR_alloc < 7) {
    std::__cxx11::string::assign((char *)&parameter_string);
    if (parameter_string._M_string_length != 0) {
      std::operator+(&node_id,&clause_kind,"_behavior");
      std::operator+(&local_198,&indent,&clause_kind);
      std::operator+(&local_178,&local_198," -- ");
      std::operator+(&local_1e0,&local_178,&node_id);
      std::operator+(&local_158,&local_1e0,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_d0,&indent,"\t");
      std::operator+(&local_b0,&local_d0,&node_id);
      std::operator+(&local_90,&local_b0," [label = \"");
      std::operator+(&local_198,&local_90,&node_id);
      std::operator+(&local_178,&local_198,"\\n ");
      std::operator+(&local_1e0,&local_178,&parameter_string);
      std::operator+(&local_158,&local_1e0,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&node_id);
    }
  }
  parameter_string._M_string_length = 0;
  *parameter_string._M_dataplus._M_p = '\0';
  if (OVar1 - OMPC_DEFAULTMAP_CATEGORY_scalar < 4) {
    std::__cxx11::string::assign((char *)&parameter_string);
  }
  if (parameter_string._M_string_length != 0) {
    std::operator+(&node_id,&clause_kind,"_category");
    std::operator+(&local_198,&indent,&clause_kind);
    std::operator+(&local_178,&local_198," -- ");
    std::operator+(&local_1e0,&local_178,&node_id);
    std::operator+(&local_158,&local_1e0,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_d0,&indent,"\t");
    std::operator+(&local_b0,&local_d0,&node_id);
    std::operator+(&local_90,&local_b0," [label = \"");
    std::operator+(&local_198,&local_90,&node_id);
    std::operator+(&local_178,&local_198,"\\n ");
    std::operator+(&local_1e0,&local_178,&parameter_string);
    std::operator+(&local_158,&local_1e0,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&node_id);
  }
  node_id._M_dataplus._M_p = (pointer)&node_id.field_2;
  node_id._M_string_length = 0;
  node_id.field_2._M_local_buf[0] = '\0';
  ppcVar2 = (this->super_OpenMPClause).expressions.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_19c = 0;
  for (; ppcVar2 !=
         (this->super_OpenMPClause).expressions.
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
    std::operator+(&local_1e0,&clause_kind,"_expr");
    std::__cxx11::to_string(&local_178,local_19c);
    std::operator+(&local_158,&local_1e0,&local_178);
    std::__cxx11::string::operator=((string *)&node_id,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator+(&local_198,&indent,&clause_kind);
    std::operator+(&local_178,&local_198," -- ");
    std::operator+(&local_1e0,&local_178,&node_id);
    std::operator+(&local_158,&local_1e0,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_d0,&indent,"\t");
    std::operator+(&local_b0,&local_d0,&node_id);
    std::operator+(&local_90,&local_b0," [label = \"");
    std::operator+(&local_198,&local_90,&node_id);
    std::operator+(&local_178,&local_198,"\\n ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar2,&local_1e1);
    std::operator+(&local_1e0,&local_178,&local_50);
    std::operator+(&local_158,&local_1e0,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    local_19c = local_19c + 1;
  }
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&clause_kind);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  return;
}

Assistant:

void OpenMPDefaultmapClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "defaultmap_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPDefaultmapClauseBehavior behavior = this->getBehavior();
    OpenMPDefaultmapClauseCategory category = this->getCategory();
    std::string parameter_string;
    switch (behavior) {
        case OMPC_DEFAULTMAP_BEHAVIOR_alloc:
            parameter_string = "alloc";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_to:
            parameter_string = "to";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_from:
            parameter_string = "from";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_tofrom:
            parameter_string = "tofrom";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_firstprivate:
            parameter_string = "firstprivate";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_none:
            parameter_string = "none";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_default:
            parameter_string = "default";
            break;
        default:
            ;
    }
    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_behavior";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
    parameter_string.clear();
    switch (category) {
        case OMPC_DEFAULTMAP_CATEGORY_scalar:
            parameter_string = "scalar";
            break;
        case OMPC_DEFAULTMAP_CATEGORY_aggregate:
            parameter_string  = "aggregate";
            break;
        case OMPC_DEFAULTMAP_CATEGORY_pointer:
            parameter_string = "pointer";
            break;
        case OMPC_DEFAULTMAP_CATEGORY_allocatable:
            parameter_string = "allocatable";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_category";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

   std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };
}